

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O0

MapcodeError
decodeMapcodeToLatLonUtf16
          (double *latDeg,double *lonDeg,unsigned_short *mapcode,Territory territory,
          MapcodeElements *mapcodeElements)

{
  undefined1 local_c8 [8];
  DecodeRec dec;
  MapcodeError ret;
  MapcodeElements *mapcodeElements_local;
  Territory territory_local;
  unsigned_short *mapcode_local;
  double *lonDeg_local;
  double *latDeg_local;
  
  if (((latDeg == (double *)0x0) || (lonDeg == (double *)0x0)) || (mapcode == (unsigned_short *)0x0)
     ) {
    latDeg_local._4_4_ = ERR_BAD_ARGUMENTS;
  }
  else {
    memset(local_c8,0,0x88);
    dec.mapcodeElements.territoryISO[0] = -1;
    dec.mapcodeElements.territoryISO[1] = -1;
    dec.mapcodeElements.territoryISO[2] = -1;
    dec.mapcodeElements.territoryISO[3] = -1;
    dec.mapcodeElements._32_8_ = mapcode;
    dec.extension._0_4_ = territory;
    dec.zone.fmaxx._4_4_ = decoderEngine((DecodeRec *)local_c8,1);
    *latDeg = (double)dec.iso;
    *lonDeg = dec.result.lat;
    if (mapcodeElements != (MapcodeElements *)0x0) {
      memcpy(mapcodeElements,local_c8,0x28);
    }
    latDeg_local._4_4_ = dec.zone.fmaxx._4_4_;
  }
  return latDeg_local._4_4_;
}

Assistant:

enum MapcodeError decodeMapcodeToLatLonUtf16(double *latDeg, double *lonDeg,
                                             const UWORD *mapcode, enum Territory territory,
                                             MapcodeElements *mapcodeElements) {
    if ((latDeg == NULL) || (lonDeg == NULL) || (mapcode == NULL)) {
        return ERR_BAD_ARGUMENTS;
    } else {
        enum MapcodeError ret;
        DecodeRec dec = {
                {"", TERRITORY_NONE, "", 0, ""},
                0,
                0,
                0,
                TERRITORY_NONE,
                0,
                {0.0, 0.0},
                {0, 0},
                {0.0, 0.0, 0.0, 0.0}
        };
        dec.orginput = (const char *) mapcode;
        dec.context = territory;

        ret = decoderEngine(&dec, FLAG_UTF16_STRING);
        *latDeg = dec.result.lat;
        *lonDeg = dec.result.lon;

        if (mapcodeElements) {
            memcpy(mapcodeElements, &dec.mapcodeElements, sizeof(MapcodeElements));
        }
        return ret;
    }
}